

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaWildcardPtr
xmlSchemaAddWildcard
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaTypeType type,xmlNodePtr node)

{
  xmlSchemaWildcardPtr ret;
  xmlNodePtr node_local;
  xmlSchemaTypeType type_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    ctxt_local = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x48);
    if (ctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaPErrMemory(ctxt,"adding wildcard",(xmlNodePtr)0x0);
      ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      memset(ctxt_local,0,0x48);
      ctxt_local->type = type;
      ctxt_local->warning = (xmlSchemaValidityWarningFunc)node;
      xmlSchemaAddItemSize(&ctxt->constructor->bucket->locals,10,ctxt_local);
    }
  }
  return (xmlSchemaWildcardPtr)ctxt_local;
}

Assistant:

static xmlSchemaWildcardPtr
xmlSchemaAddWildcard(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
		     xmlSchemaTypeType type, xmlNodePtr node)
{
    xmlSchemaWildcardPtr ret = NULL;

    if ((ctxt == NULL) || (schema == NULL))
        return (NULL);

    ret = (xmlSchemaWildcardPtr) xmlMalloc(sizeof(xmlSchemaWildcard));
    if (ret == NULL) {
        xmlSchemaPErrMemory(ctxt, "adding wildcard", NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaWildcard));
    ret->type = type;
    ret->node = node;
    WXS_ADD_LOCAL(ctxt, ret);
    return (ret);
}